

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

int spin_acquire_lock(int *sl)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 1;
  do {
    if (*sl == 0) {
      LOCK();
      iVar1 = *sl;
      *sl = 1;
      UNLOCK();
      if (iVar1 == 0) {
        return 0;
      }
    }
    if ((uVar2 & 0x3f) == 0) {
      sched_yield();
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static int spin_acquire_lock(int *sl) {
  int spins = 0;
  while (*(volatile int *)sl != 0 || CAS_LOCK(sl)) {
    if ((++spins & SPINS_PER_YIELD) == 0) {
      SPIN_LOCK_YIELD;
    }
  }
  return 0;
}